

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

void TransposeTest(void)

{
  abctime aVar1;
  abctime aVar2;
  word wVar3;
  abctime clk;
  int i;
  word N [64];
  word M [64];
  
  Aig_ManRandom64(1);
  for (clk._4_4_ = 0; clk._4_4_ < 0x40; clk._4_4_ = clk._4_4_ + 1) {
    wVar3 = 0xffffffffffffffff;
    if (clk._4_4_ != 0) {
      wVar3 = 0;
    }
    N[(long)clk._4_4_ + 0x3f] = wVar3;
  }
  aVar1 = Abc_Clock();
  for (clk._4_4_ = 0; clk._4_4_ < 0x186a1; clk._4_4_ = clk._4_4_ + 1) {
    transpose64Simple(N + 0x3f,(word *)&stack0xfffffffffffffbf8);
  }
  aVar2 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar2 - aVar1);
  aVar1 = Abc_Clock();
  for (clk._4_4_ = 0; clk._4_4_ < 0x186a1; clk._4_4_ = clk._4_4_ + 1) {
    transpose64(N + 0x3f);
  }
  aVar2 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar2 - aVar1);
  for (clk._4_4_ = 0; clk._4_4_ < 0x40; clk._4_4_ = clk._4_4_ + 1) {
    if (N[(long)clk._4_4_ + 0x3f] != *(word *)(&stack0xfffffffffffffbf8 + (long)clk._4_4_ * 8)) {
      Abc_Print(1,"Mismatch\n");
    }
  }
  return;
}

Assistant:

void TransposeTest()
{
    word M[64], N[64];
    int i;
    abctime clk;
    Aig_ManRandom64( 1 );
//    for ( i = 0; i < 64; i++ )
//        M[i] = Aig_ManRandom64( 0 );
    for ( i = 0; i < 64; i++ )
        M[i] = i? (word)0 : ~(word)0;
//    for ( i = 0; i < 64; i++ )
//        Extra_PrintBinary( stdout, (unsigned *)&M[i], 64 ), Abc_Print( 1, "\n" );

    clk = Abc_Clock();
    for ( i = 0; i < 100001; i++ )
        transpose64Simple( M, N );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    for ( i = 0; i < 100001; i++ )
        transpose64( M );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    for ( i = 0; i < 64; i++ )
        if ( M[i] != N[i] )
            Abc_Print( 1, "Mismatch\n" );
/*
    Abc_Print( 1, "\n" );
    for ( i = 0; i < 64; i++ )
        Extra_PrintBinary( stdout, (unsigned *)&M[i], 64 ), Abc_Print( 1, "\n" );
    Abc_Print( 1, "\n" );
    for ( i = 0; i < 64; i++ )
        Extra_PrintBinary( stdout, (unsigned *)&N[i], 64 ), Abc_Print( 1, "\n" );
*/
}